

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arkode_io.c
# Opt level: O0

int arkSetForcePass(void *arkode_mem,int force_pass)

{
  undefined4 in_ESI;
  long in_RDI;
  ARKodeMem ark_mem;
  int local_4;
  
  if (in_RDI == 0) {
    arkProcessError((ARKodeMem)0x0,-0x15,0xba4,"arkSetForcePass",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/opencor[P]sundials/src/arkode/arkode_io.c"
                    ,"arkode_mem = NULL illegal.");
    local_4 = -0x15;
  }
  else {
    *(undefined4 *)(in_RDI + 0x3d4) = in_ESI;
    local_4 = 0;
  }
  return local_4;
}

Assistant:

int arkSetForcePass(void* arkode_mem, sunbooleantype force_pass)
{
  ARKodeMem ark_mem;
  if (arkode_mem == NULL)
  {
    arkProcessError(NULL, ARK_MEM_NULL, __LINE__, __func__, __FILE__,
                    MSG_ARK_NO_MEM);
    return (ARK_MEM_NULL);
  }
  ark_mem = (ARKodeMem)arkode_mem;

  ark_mem->force_pass = force_pass;

  return (ARK_SUCCESS);
}